

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O0

bool __thiscall LTFlightData::AircraftMaintenance(LTFlightData *this,double simTime)

{
  bool bVar1;
  bool bVar2;
  flightPhaseE fVar3;
  undefined1 uVar4;
  int iVar5;
  uint uVar6;
  size_type sVar7;
  reference pvVar8;
  double *pdVar9;
  LTFlightData *in_RDI;
  double in_XMM0_Qa;
  double dVar10;
  double in_stack_00000020;
  LTFlightData *in_stack_00000028;
  LTFlightData *in_stack_00000070;
  system_error *e;
  unique_lock<std::recursive_mutex> lock;
  LabelCfgTy *in_stack_fffffffffffffef8;
  unique_lock<std::recursive_mutex> *in_stack_ffffffffffffff00;
  double local_f8;
  LTFlightData *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined8 in_stack_ffffffffffffff28;
  undefined1 bAllowNanAltIfGnd;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  double in_stack_ffffffffffffff98;
  LTFlightData *in_stack_ffffffffffffffa0;
  unique_lock<std::recursive_mutex> local_28;
  double local_18;
  LTFlightData *simTime_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar11;
  
  bAllowNanAltIfGnd = (undefined1)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  uVar4 = (undefined1)((ulong)in_stack_ffffffffffffff18 >> 0x38);
  local_18 = in_XMM0_Qa;
  simTime_00 = in_RDI;
  std::unique_lock<std::recursive_mutex>::unique_lock(&local_28,&in_RDI->dataAccessMutex);
  bVar1 = std::unique_lock::operator_cast_to_bool((unique_lock<std::recursive_mutex> *)0x1df8fb);
  if (bVar1) {
    DataRefs::GetLabelCfg(&dataRefs);
    bVar1 = DataRefs::LabelCfgTy::operator!=
                      ((LabelCfgTy *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    if (bVar1) {
      UpdateStaticLabel(in_stack_00000070);
    }
    bVar1 = DataRefs::IsReInitAll(&dataRefs);
    if (bVar1) {
      SetInvalid((LTFlightData *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 (bool)uVar4);
      bVar11 = 1;
    }
    else {
      bVar1 = hasAc(in_RDI);
      if (bVar1) {
        bVar2 = XPMP2::Aircraft::IsValid(&in_RDI->pAc->super_Aircraft);
        bVar1 = true;
        if (bVar2) {
          LTAircraft::GetVecView((vectorTy *)&stack0xffffffffffffff98,in_RDI->pAc);
          iVar5 = DataRefs::GetFdStdDistance_m(&dataRefs);
          bVar1 = (double)iVar5 < (double)in_stack_ffffffffffffffa0;
        }
        if (bVar1) {
          DestroyAircraft(in_stack_ffffffffffffff10);
        }
        else {
          fVar3 = LTAircraft::GetFlightPhase(in_RDI->pAc);
          if (((0x45 < fVar3) ||
              ((fVar3 = LTAircraft::GetFlightPhase(in_RDI->pAc), 0x3b < fVar3 &&
               (bVar1 = positionTy::isNormal
                                  ((positionTy *)
                                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                   (bool)bAllowNanAltIfGnd), bVar1)))) &&
             (fVar3 = LTAircraft::GetFlightPhase(in_RDI->pAc), fVar3 < FPH_STOPPED_ON_RWY)) {
            bVar11 = 0;
            goto LAB_001dfe5e;
          }
        }
      }
      else {
        while( true ) {
          sVar7 = std::deque<positionTy,_std::allocator<positionTy>_>::size
                            ((deque<positionTy,_std::allocator<positionTy>_> *)0x1dfc64);
          bVar1 = false;
          if (1 < sVar7) {
            pvVar8 = std::deque<positionTy,_std::allocator<positionTy>_>::operator[]
                               ((deque<positionTy,_std::allocator<positionTy>_> *)
                                in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
            pdVar9 = positionTy::ts(pvVar8);
            bVar1 = *pdVar9 < local_18;
          }
          if (!bVar1) break;
          std::deque<positionTy,_std::allocator<positionTy>_>::pop_front
                    ((deque<positionTy,_std::allocator<positionTy>_> *)in_stack_ffffffffffffff00);
        }
        sVar7 = std::deque<positionTy,_std::allocator<positionTy>_>::size
                          ((deque<positionTy,_std::allocator<positionTy>_> *)0x1dfce3);
        if (1 < sVar7) {
          bVar1 = validForAcCreate((LTFlightData *)
                                   CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                   (double)simTime_00);
          if (bVar1) {
            CreateAircraft(in_stack_00000028,in_stack_00000020);
          }
          else {
            pvVar8 = std::deque<positionTy,_std::allocator<positionTy>_>::front
                               ((deque<positionTy,_std::allocator<positionTy>_> *)
                                in_stack_ffffffffffffff10);
            pdVar9 = positionTy::ts(pvVar8);
            if (*pdVar9 <= local_18) {
              TriggerCalcNewPos(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
            }
          }
        }
      }
      dVar10 = in_RDI->youngestTS;
      iVar5 = DataRefs::GetAcOutdatedIntvl((DataRefs *)0x1dfda6);
      dVar10 = dVar10 + (double)iVar5;
      uVar6 = std::isnan(local_18);
      uVar4 = (undefined1)uVar6;
      if ((uVar6 & 1) == 0) {
        local_f8 = local_18;
      }
      else {
        local_f8 = DataRefs::GetSimTime(&dataRefs);
      }
      if (local_f8 <= dVar10) {
        bVar11 = 0;
      }
      else {
        SetInvalid((LTFlightData *)CONCAT17(uVar4,in_stack_ffffffffffffff20),
                   SUB81((ulong)dVar10 >> 0x38,0));
        bVar11 = 1;
      }
    }
  }
  else {
    bVar11 = 0;
  }
LAB_001dfe5e:
  std::unique_lock<std::recursive_mutex>::~unique_lock(in_stack_ffffffffffffff00);
  return (bool)(bVar11 & 1);
}

Assistant:

bool LTFlightData::AircraftMaintenance ( double simTime )
{
    try {
        // try to lock data access
        std::unique_lock<std::recursive_mutex> lock (dataAccessMutex, std::try_to_lock);
        if ( !lock )                // we didn't get the lock, just return w/o deletion
            return false;
        
        // do we need to recalc the static part of the a/c label due to config change?
        if (dataRefs.GetLabelCfg() != labelCfg)
            UpdateStaticLabel();
        
        // general re-init necessary?
        if (dataRefs.IsReInitAll()) {
            SetInvalid(false);
            return true;
        }

        // Tests on an existing aircraft object
        if (hasAc())
        {
            // if the a/c became invalid or has flown out of sight
            // then remove the aircraft object,
            // but retain the remaining flight data
            if (!pAc->IsValid() ||
                pAc->GetVecView().dist > dataRefs.GetFdStdDistance_m())
                DestroyAircraft();
            else {
                // cover the special case of finishing landing and roll-out without live positions
                // i.e. during approach and landing we don't destroy the aircraft
                //      if it is approaching some runway
                //      until it finally stopped on the runway
                if ((pAc->GetFlightPhase() >= FPH_LANDING ||
                        (pAc->GetFlightPhase() >= FPH_APPROACH && posRwy.isNormal())) &&
                    pAc->GetFlightPhase() < FPH_STOPPED_ON_RWY)
                {
                    return false;
                }
            }
        }
        // Tests when not (yet) having an aircraft object
        else {
            // Remove position from the beginning for as long as there is past data,
            // i.e.: Only the .front pos may be in the past
            while (posDeque.size() >= 2 && posDeque[1].ts() < simTime)
                posDeque.pop_front();

            // Have at least two positions?
            if (posDeque.size() >= 2 ) {
                // is already valid for a/c creation?
                if ( validForAcCreate(simTime) )
                    // then do create the aircraft
                    CreateAircraft(simTime);
                else // not yet valid
                    // but the oldest position is at or before current simTime?
                    // then chances are good that we can calculate positions
                    if ( posDeque.front().ts() <= simTime)
                        // start thread for position calculation...next time we might be valid for creation
                        TriggerCalcNewPos(NAN);
            }
        }
            
        // youngestTS longer ago than allowed? -> remove the entire FD object
        if (youngestTS + dataRefs.GetAcOutdatedIntvl() <
            (std::isnan(simTime) ? dataRefs.GetSimTime() : simTime))
        {
            SetInvalid(false);
            return true;
        }

        // don't delete me
        return false;
        
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    } catch(...) {
    }
    
    // in case of error return 'delete me'
    SetInvalid();
    return true;
}